

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

double __thiscall
despot::Parser::GetReward
          (Parser *this,vector<int,_std::allocator<int>_> *prev_state,
          vector<int,_std::allocator<int>_> *curr_state,ACT_TYPE action)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  double extraout_XMM0_Qa;
  int local_3c;
  double dStack_38;
  int r;
  double reward;
  int local_28;
  int s_1;
  int s;
  ACT_TYPE action_local;
  vector<int,_std::allocator<int>_> *curr_state_local;
  vector<int,_std::allocator<int>_> *prev_state_local;
  Parser *this_local;
  
  local_28 = 0;
  while( true ) {
    sVar2 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::size
                      (&this->prev_state_vars_);
    if (sVar2 <= (ulong)(long)local_28) break;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](prev_state,(long)local_28);
    vVar1 = *pvVar3;
    pvVar4 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                       (&this->prev_state_vars_,(long)local_28);
    (pvVar4->super_NamedVar).super_Variable.curr_value = vVar1;
    local_28 = local_28 + 1;
  }
  reward._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::size
                      (&this->curr_state_vars_);
    if (sVar2 <= (ulong)(long)reward._4_4_) break;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](curr_state,(long)reward._4_4_);
    vVar1 = *pvVar3;
    pvVar4 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                       (&this->curr_state_vars_,(long)reward._4_4_);
    (pvVar4->super_NamedVar).super_Variable.curr_value = vVar1;
    reward._4_4_ = reward._4_4_ + 1;
  }
  pvVar5 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                     (&this->action_vars_,0);
  (pvVar5->super_Variable).curr_value = action;
  dStack_38 = 0.0;
  local_3c = 0;
  while( true ) {
    sVar2 = std::vector<despot::Function,_std::allocator<despot::Function>_>::size
                      (&this->reward_funcs_);
    if (sVar2 <= (ulong)(long)local_3c) break;
    pvVar6 = std::vector<despot::Function,_std::allocator<despot::Function>_>::operator[]
                       (&this->reward_funcs_,(long)local_3c);
    (*pvVar6->_vptr_Function[5])(pvVar6,0);
    dStack_38 = extraout_XMM0_Qa + dStack_38;
    local_3c = local_3c + 1;
  }
  return dStack_38;
}

Assistant:

double Parser::GetReward(const vector<int>& prev_state,
	const vector<int>& curr_state, ACT_TYPE action) const {
	for (int s = 0; s < prev_state_vars_.size(); s++)
		prev_state_vars_[s].curr_value = prev_state[s];
	for (int s = 0; s < curr_state_vars_.size(); s++)
		curr_state_vars_[s].curr_value = curr_state[s];
	action_vars_[0].curr_value = action;

	double reward = 0;
	for (int r = 0; r < reward_funcs_.size(); r++)
		reward += reward_funcs_[r].GetValue();
	return reward;
}